

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int scoreFlags(long flags1,long flags2)

{
  int bits;
  int trait;
  int score;
  long flags2_local;
  long flags1_local;
  
  score = 0;
  trait = 1;
  for (bits = 0; bits < 0x20; bits = bits + 1) {
    if (((flags1 & trait) != 0) && ((flags2 & trait) != 0)) {
      score = score + 1;
    }
    trait = trait << 1;
  }
  return -score;
}

Assistant:

int scoreFlags(long flags1, long flags2) {
    int score = 0;
    int trait = 1;
    for(int bits=0; bits<32; bits++) {
        if ( (flags1 & trait) &&
             (flags2 & trait) )
            score++;
        trait <<= 1;
    }
    return -score;
}